

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

void str_ncopy(char *to,char *from,int maxchars)

{
  if (from != (char *)0x0) {
    strncpy(to,from,0x20);
    to = to + 0x1f;
  }
  *to = '\0';
  return;
}

Assistant:

private void str_ncopy(to, from, maxchars)
    char    *to;        /* space to copy to */
    char    *from;        /* space to copy from */
    int        maxchars;    /* max # of chars (including NUL) copied */
{
    if (from == (char *)NULL)
    {
        to[0] = '\0';
        return;
    }

    /* copy up to maxchars chars */
    (void)strncpy(to, from, maxchars);

    /* ensure to is NUL-terminated */
    to[maxchars-1] = '\0';
}